

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

void png_handle_tEXt(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  png_uint_32 pVar1;
  uint uVar2;
  png_bytep ppVar3;
  int iVar4;
  long lVar5;
  char *error_message;
  png_text local_58;
  
  pVar1 = png_ptr->user_chunk_cache_max;
  if (pVar1 != 0) {
    if (pVar1 == 1) {
      png_crc_finish(png_ptr,length);
      return;
    }
    png_ptr->user_chunk_cache_max = pVar1 - 1;
    if (pVar1 - 1 == 1) {
      png_crc_finish(png_ptr,length);
      error_message = "no space in chunk cache";
      goto LAB_002852b7;
    }
  }
  uVar2 = png_ptr->mode;
  if ((uVar2 & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((uVar2 & 4) != 0) {
    png_ptr->mode = uVar2 | 8;
  }
  local_58.key = (png_charp)png_read_buffer(png_ptr,(ulong)(length + 1),1);
  if ((png_bytep)local_58.key != (png_bytep)0x0) {
    png_crc_read(png_ptr,(png_bytep)local_58.key,length);
    iVar4 = png_crc_finish(png_ptr,0);
    if (iVar4 == 0) {
      ((png_bytep)local_58.key)[length] = '\0';
      lVar5 = (ulong)length + 1;
      ppVar3 = (png_bytep)local_58.key + -1;
      do {
        local_58.text = (png_charp)ppVar3;
        lVar5 = lVar5 + -1;
        ppVar3 = (png_bytep)local_58.text + 1;
      } while (((png_bytep)local_58.text)[1] != '\0');
      local_58.text = (png_charp)((png_bytep)local_58.text + (2 - (ulong)(lVar5 == 0)));
      local_58.compression = -1;
      local_58.itxt_length = 0;
      local_58.lang = (png_charp)0x0;
      local_58.lang_key = (png_charp)0x0;
      local_58.text_length = strlen(local_58.text);
      iVar4 = png_set_text_2(png_ptr,info_ptr,&local_58,1);
      if (iVar4 != 0) {
        png_warning(png_ptr,"Insufficient memory to process text chunk");
      }
    }
    return;
  }
  error_message = "out of memory";
LAB_002852b7:
  png_chunk_benign_error(png_ptr,error_message);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_tEXt(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_text  text_info;
   png_bytep buffer;
   png_charp key;
   png_charp text;
   png_uint_32 skip = 0;

   png_debug(1, "in png_handle_tEXt");

#ifdef PNG_USER_LIMITS_SUPPORTED
   if (png_ptr->user_chunk_cache_max != 0)
   {
      if (png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         return;
      }

      if (--png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "no space in chunk cache");
         return;
      }
   }
#endif

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
      png_ptr->mode |= PNG_AFTER_IDAT;

#ifdef PNG_MAX_MALLOC_64K
   if (length > 65535U)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "too large to fit in memory");
      return;
   }
#endif

   buffer = png_read_buffer(png_ptr, length+1, 1/*warn*/);

   if (buffer == NULL)
   {
      png_chunk_benign_error(png_ptr, "out of memory");
      return;
   }

   png_crc_read(png_ptr, buffer, length);

   if (png_crc_finish(png_ptr, skip) != 0)
      return;

   key = (png_charp)buffer;
   key[length] = 0;

   for (text = key; *text; text++)
      /* Empty loop to find end of key */ ;

   if (text != key + length)
      text++;

   text_info.compression = PNG_TEXT_COMPRESSION_NONE;
   text_info.key = key;
   text_info.lang = NULL;
   text_info.lang_key = NULL;
   text_info.itxt_length = 0;
   text_info.text = text;
   text_info.text_length = strlen(text);

   if (png_set_text_2(png_ptr, info_ptr, &text_info, 1) != 0)
      png_warning(png_ptr, "Insufficient memory to process text chunk");
}